

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visit
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          Expression *curr)

{
  bool bVar1;
  undefined8 in_RAX;
  Type left;
  ostream *poVar2;
  uint uVar3;
  undefined8 uStack_38;
  
  uVar3 = this->depth + 1;
  this->depth = uVar3;
  uStack_38 = in_RAX;
  if (this->maxDepth < uVar3 && this->maxDepth != 0) {
    (*this->_vptr_ExpressionRunner[3])(this,"interpreter recursion limit");
  }
  Visitor<wasm::PrecomputingExpressionRunner,_wasm::Flow>::visit
            (__return_storage_ptr__,(Visitor<wasm::PrecomputingExpressionRunner,_wasm::Flow> *)this,
             curr);
  if ((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) {
    left = Literals::getType(&__return_storage_ptr__->values);
    if ((1 < left.id) || (1 < (curr->type).id)) {
      bVar1 = wasm::Type::isSubType(left,(Type)(curr->type).id);
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"expected ",9);
        poVar2 = wasm::operator<<((ostream *)&std::cerr,(Type)(curr->type).id);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", seeing ",9);
        poVar2 = wasm::operator<<(poVar2,left);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," from\n",6);
        poVar2 = std::operator<<(poVar2,curr);
        uStack_38 = CONCAT17(10,(undefined7)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 7),1);
      }
      bVar1 = wasm::Type::isSubType(left,(Type)(curr->type).id);
      if (!bVar1) {
        __assert_fail("Type::isSubType(type, curr->type)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                      ,0xcf,
                      "Flow wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visit(Expression *) [SubType = wasm::PrecomputingExpressionRunner]"
                     );
      }
    }
  }
  this->depth = this->depth - 1;
  return __return_storage_ptr__;
}

Assistant:

Flow visit(Expression* curr) {
    depth++;
    if (maxDepth != NO_LIMIT && depth > maxDepth) {
      hostLimit("interpreter recursion limit");
    }
    auto ret = OverriddenVisitor<SubType, Flow>::visit(curr);
    if (!ret.breaking()) {
      Type type = ret.getType();
      if (type.isConcrete() || curr->type.isConcrete()) {
#if 1 // def WASM_INTERPRETER_DEBUG
        if (!Type::isSubType(type, curr->type)) {
          std::cerr << "expected " << curr->type << ", seeing " << type
                    << " from\n"
                    << *curr << '\n';
        }
#endif
        assert(Type::isSubType(type, curr->type));
      }
    }
    depth--;
    return ret;
  }